

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void sha256_calc(uint8_t *hash,void *input,size_t len)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  undefined1 *__s;
  uint uVar9;
  ulong __n;
  uint32_t h [8];
  uint8_t chunk [64];
  uint32_t w [64];
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int local_1b4;
  undefined8 local_1b0;
  uint8_t *local_1a8;
  ulong local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint local_138 [66];
  
  local_188 = 0x9b05688c510e527f;
  uStack_180 = 0x5be0cd191f83d9ab;
  local_198 = 0xbb67ae856a09e667;
  uStack_190 = 0xa54ff53a3c6ef372;
  local_1b4 = (int)len * 8;
  local_1a0 = len >> 5;
  local_1b0 = 0;
  local_1e0 = (undefined8 *)input;
  local_1a8 = hash;
  bVar3 = false;
  while( true ) {
    bVar4 = bVar3;
    if (!bVar3) {
      if (len < 0x40) {
        memcpy(&local_178,local_1e0,len);
        __s = (undefined1 *)((long)&local_178 + len);
        lVar5 = 0x40;
        if ((int)local_1b0 == 0) {
          *__s = 0x80;
          __s = (undefined1 *)((long)&local_178 + len + 1);
          lVar5 = 0x3f;
          local_1b0 = 1;
        }
        local_1e0 = (undefined8 *)((long)local_1e0 + len);
        __n = lVar5 - len;
        if (__n < 8) {
          memset(__s,0,__n);
        }
        else {
          memset(__s,0,__n - 8);
          __s[__n - 1] = (char)local_1b4;
          lVar5 = 7;
          uVar7 = local_1a0;
          do {
            __s[lVar5 + (__n - 9)] = (char)uVar7;
            uVar7 = uVar7 >> 8;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
          bVar4 = true;
        }
        len = 0;
      }
      else {
        local_148 = local_1e0[6];
        uStack_140 = local_1e0[7];
        local_158 = local_1e0[4];
        uStack_150 = local_1e0[5];
        local_168 = local_1e0[2];
        uStack_160 = local_1e0[3];
        local_178 = *local_1e0;
        uStack_170 = local_1e0[1];
        local_1e0 = local_1e0 + 8;
        len = len - 0x40;
      }
    }
    if (bVar3) break;
    memset(local_138,0,0x100);
    lVar5 = 0;
    do {
      uVar2 = *(uint *)((long)&local_178 + lVar5 * 4);
      local_138[lVar5] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    lVar5 = 0x10;
    do {
      uVar2 = *(uint *)((long)&local_178 + lVar5 * 4 + 4);
      uVar6 = local_138[lVar5 + -2];
      local_138[lVar5] =
           (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7)) +
           *(int *)((long)&local_178 + lVar5 * 4) + *(int *)((long)&local_158 + lVar5 * 4 + 4) +
           (uVar6 >> 10 ^ (uVar6 << 0xd | uVar6 >> 0x13) ^ (uVar6 << 0xf | uVar6 >> 0x11));
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
    local_1c8 = local_188;
    uStack_1c0 = uStack_180;
    local_1d8 = local_198;
    uStack_1d0 = uStack_190;
    local_1c8._0_4_ = (uint)local_188;
    local_1c8._4_4_ = (uint)((ulong)local_188 >> 0x20);
    uStack_1c0._0_4_ = (uint)uStack_180;
    uStack_1c0._4_4_ = (uint)((ulong)uStack_180 >> 0x20);
    local_1d8._0_4_ = (uint)local_198;
    local_1d8._4_4_ = (uint)((ulong)local_198 >> 0x20);
    uStack_1d0._0_4_ = (uint)uStack_190;
    uStack_1d0._4_4_ = (uint)((ulong)uStack_190 >> 0x20);
    lVar5 = 0;
    do {
      uVar2 = local_1d8._4_4_;
      uVar9 = (uint)uStack_1d0;
      local_1d8._4_4_ = (uint)local_1d8;
      uVar6 = (uint)uStack_1c0;
      uStack_1c0._0_4_ = local_1c8._4_4_;
      local_1c8._4_4_ = (uint)local_1c8;
      iVar8 = (~local_1c8._4_4_ & uVar6) + ((uint)uStack_1c0 & local_1c8._4_4_) + uStack_1c0._4_4_ +
              ((local_1c8._4_4_ << 7 | local_1c8._4_4_ >> 0x19) ^
              (local_1c8._4_4_ << 0x15 | local_1c8._4_4_ >> 0xb) ^
              (local_1c8._4_4_ << 0x1a | local_1c8._4_4_ >> 6)) + *(int *)((long)k + lVar5) +
              *(int *)((long)local_138 + lVar5);
      local_1c8._0_4_ = uStack_1d0._4_4_ + iVar8;
      local_1d8._0_4_ =
           (uVar9 & uVar2 ^ (uVar9 ^ uVar2) & local_1d8._4_4_) +
           ((local_1d8._4_4_ << 10 | local_1d8._4_4_ >> 0x16) ^
           (local_1d8._4_4_ << 0x13 | local_1d8._4_4_ >> 0xd) ^
           (local_1d8._4_4_ << 0x1e | local_1d8._4_4_ >> 2)) + iVar8;
      lVar5 = lVar5 + 4;
      uStack_1c0._4_4_ = uVar6;
      uStack_1d0._0_4_ = uVar2;
      uStack_1d0._4_4_ = uVar9;
    } while (lVar5 != 0x100);
    uStack_1c0 = CONCAT44(uVar6,(uint)uStack_1c0);
    uStack_1d0 = CONCAT44(uVar9,uVar2);
    lVar5 = 0;
    do {
      piVar1 = (int *)((long)&local_198 + lVar5 * 4);
      *piVar1 = *piVar1 + *(int *)((long)&local_1d8 + lVar5 * 4);
      lVar5 = lVar5 + 1;
      bVar3 = bVar4;
    } while (lVar5 != 8);
  }
  lVar5 = 0;
  do {
    uVar2 = *(uint *)((long)&local_198 + lVar5 * 4);
    *(uint *)(local_1a8 + lVar5 * 4) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  return;
}

Assistant:

void sha256_calc(uint8_t hash[32], const void * input, size_t len)
{
   uint32_t h[] = { 0x6a09e667, 0xbb67ae85, 0x3c6ef372, 0xa54ff53a, 0x510e527f, 0x9b05688c, 0x1f83d9ab, 0x5be0cd19 };
   int i, j;

   uint8_t chunk[64];

   struct buffer_state state;

   init_buf_state(&state, input, len);

   while (calc_chunk(chunk, &state)) {
      uint32_t ah[8];

      uint32_t w[64];
      const uint8_t *p = chunk;

      memset(w, 0x00, sizeof w);
      for (i = 0; i < 16; i++) {
         w[i] = (uint32_t) p[0] << 24 | (uint32_t) p[1] << 16 |
            (uint32_t) p[2] << 8 | (uint32_t) p[3];
         p += 4;
      }

      for (i = 16; i < 64; i++) {
         const uint32_t s0 = right_rot(w[i - 15], 7) ^ right_rot(w[i - 15], 18) ^ (w[i - 15] >> 3);
         const uint32_t s1 = right_rot(w[i - 2], 17) ^ right_rot(w[i - 2], 19) ^ (w[i - 2] >> 10);
         w[i] = w[i - 16] + s0 + w[i - 7] + s1;
      }

      for (i = 0; i < 8; i++)
         ah[i] = h[i];

      for (i = 0; i < 64; i++) {
         const uint32_t s1 = right_rot(ah[4], 6) ^ right_rot(ah[4], 11) ^ right_rot(ah[4], 25);
         const uint32_t ch = (ah[4] & ah[5]) ^ (~ah[4] & ah[6]);
         const uint32_t temp1 = ah[7] + s1 + ch + k[i] + w[i];
         const uint32_t s0 = right_rot(ah[0], 2) ^ right_rot(ah[0], 13) ^ right_rot(ah[0], 22);
         const uint32_t maj = (ah[0] & ah[1]) ^ (ah[0] & ah[2]) ^ (ah[1] & ah[2]);
         const uint32_t temp2 = s0 + maj;

         ah[7] = ah[6];
         ah[6] = ah[5];
         ah[5] = ah[4];
         ah[4] = ah[3] + temp1;
         ah[3] = ah[2];
         ah[2] = ah[1];
         ah[1] = ah[0];
         ah[0] = temp1 + temp2;
      }

      for (i = 0; i < 8; i++)
         h[i] += ah[i];
   }

   for (i = 0, j = 0; i < 8; i++)
   {
      hash[j++] = (uint8_t) (h[i] >> 24);
      hash[j++] = (uint8_t) (h[i] >> 16);
      hash[j++] = (uint8_t) (h[i] >> 8);
      hash[j++] = (uint8_t) h[i];
   }
}